

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O1

void __thiscall RK_Individual::resetaPesos(RK_Individual *this,float valor)

{
  int iVar1;
  double *pdVar2;
  long lVar3;
  
  iVar1 = this->number_of_edges;
  if (0 < (long)iVar1) {
    pdVar2 = this->weights;
    lVar3 = 0;
    do {
      pdVar2[lVar3] = (double)valor;
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  return;
}

Assistant:

void RK_Individual::resetaPesos(float valor){
    for(int i=0; i< this->getNumEdges(); i++)
        this->weights[i] = valor;
}